

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateExtInstImport(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  DiagnosticStream *this;
  DiagnosticStream local_220;
  undefined1 local_48 [8];
  string name;
  int name_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  name.field_2._12_4_ = 1;
  uVar2 = ValidationState_t::version(_);
  if ((uVar2 < 0x10501) &&
     (bVar1 = ValidationState_t::HasExtension(_,kSPV_KHR_non_semantic_info), !bVar1)) {
    Instruction::GetOperandAs<std::__cxx11::string>((string *)local_48,inst,1);
    lVar3 = std::__cxx11::string::find(local_48,0x5dff74);
    if (lVar3 == 0) {
      ValidationState_t::diag(&local_220,_,SPV_ERROR_INVALID_DATA,inst);
      this = DiagnosticStream::operator<<
                       (&local_220,
                        (char (*) [92])
                        "NonSemantic extended instruction sets cannot be declared without SPV_KHR_non_semantic_info."
                       );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
      DiagnosticStream::~DiagnosticStream(&local_220);
    }
    std::__cxx11::string::~string((string *)local_48);
    if (lVar3 == 0) {
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateExtInstImport(ValidationState_t& _,
                                   const Instruction* inst) {
  const auto name_id = 1;
  if (_.version() <= SPV_SPIRV_VERSION_WORD(1, 5) &&
      !_.HasExtension(kSPV_KHR_non_semantic_info)) {
    const std::string name = inst->GetOperandAs<std::string>(name_id);
    if (name.find("NonSemantic.") == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "NonSemantic extended instruction sets cannot be declared "
                "without SPV_KHR_non_semantic_info.";
    }
  }

  return SPV_SUCCESS;
}